

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O1

uint32_t find_firstassertedcu(PCRE2_SPTR16 code,int32_t *flags,uint32_t inassert)

{
  ushort uVar1;
  bool bVar2;
  uint32_t uVar3;
  ulong uVar4;
  PCRE2_UCHAR16 *code_00;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint32_t uVar8;
  int dflags;
  int local_3c;
  int *local_38;
  
  *flags = -1;
  uVar8 = 0;
  iVar6 = -1;
  local_38 = flags;
  do {
    uVar5 = *code - 0x85;
    if ((5 < uVar5) || (uVar4 = 1, (0x23U >> (uVar5 & 0x1f) & 1) == 0)) {
      uVar4 = (ulong)(*code == 0x8b);
    }
    code_00 = first_significant_code(code + uVar4 + 2,1);
    uVar1 = *code_00;
    bVar2 = false;
    if (uVar1 < 0x36) {
      if (uVar1 < 0x29) {
        if ((1 < uVar1 - 0x23) && (uVar1 != 0x1d)) {
          if (uVar1 != 0x1e) goto LAB_00143e79;
          goto LAB_00143e51;
        }
LAB_00143e3b:
        bVar2 = false;
        if (inassert != 0) {
          uVar1 = code_00[1];
          uVar3 = (uint32_t)uVar1;
          if (iVar6 < 0) {
            iVar7 = 0;
            goto LAB_00143e6e;
          }
          goto LAB_00143e5d;
        }
      }
      else {
        if (1 < uVar1 - 0x30) {
          if (uVar1 == 0x29) {
            code_00 = code_00 + 1;
          }
          else {
            bVar2 = false;
            if (uVar1 != 0x2b) goto LAB_00143e79;
          }
          goto LAB_00143e3b;
        }
LAB_00143e51:
        if (inassert != 0) {
          uVar1 = code_00[1];
          uVar3 = (uint32_t)uVar1;
          if (iVar6 < 0) {
            iVar7 = 1;
            goto LAB_00143e6e;
          }
LAB_00143e5d:
          iVar7 = iVar6;
          uVar3 = uVar8;
          if (uVar8 == uVar1) goto LAB_00143e6e;
        }
LAB_00143e62:
        bVar2 = false;
      }
    }
    else {
      if ((0xd < uVar1 - 0x7e) || ((0x31f1U >> (uVar1 - 0x7e & 0x1f) & 1) == 0)) {
        if (uVar1 == 0x36) {
          code_00 = code_00 + 1;
        }
        else {
          bVar2 = false;
          if (uVar1 != 0x38) goto LAB_00143e79;
        }
        goto LAB_00143e51;
      }
      uVar3 = find_firstassertedcu(code_00,&local_3c,(uVar1 == 0x7e) + inassert);
      if (local_3c < 0) goto LAB_00143e62;
      iVar7 = local_3c;
      if ((-1 < iVar6) &&
         ((bVar2 = false, uVar8 != uVar3 || (iVar7 = iVar6, uVar3 = uVar8, iVar6 != local_3c))))
      goto LAB_00143e79;
LAB_00143e6e:
      code = code + code[1];
      iVar6 = iVar7;
      uVar8 = uVar3;
      bVar2 = true;
    }
LAB_00143e79:
    if (!bVar2) {
      return 0;
    }
    if (*code != 0x78) {
      *local_38 = iVar6;
      return uVar8;
    }
  } while( true );
}

Assistant:

static uint32_t
find_firstassertedcu(PCRE2_SPTR code, int32_t *flags, uint32_t inassert)
{
uint32_t c = 0;
int cflags = REQ_NONE;

*flags = REQ_NONE;
do {
   uint32_t d;
   int dflags;
   int xl = (*code == OP_CBRA || *code == OP_SCBRA ||
             *code == OP_CBRAPOS || *code == OP_SCBRAPOS)? IMM2_SIZE:0;
   PCRE2_SPTR scode = first_significant_code(code + 1+LINK_SIZE + xl, TRUE);
   PCRE2_UCHAR op = *scode;

   switch(op)
     {
     default:
     return 0;

     case OP_BRA:
     case OP_BRAPOS:
     case OP_CBRA:
     case OP_SCBRA:
     case OP_CBRAPOS:
     case OP_SCBRAPOS:
     case OP_ASSERT:
     case OP_ONCE:
     d = find_firstassertedcu(scode, &dflags, inassert + ((op==OP_ASSERT)?1:0));
     if (dflags < 0)
       return 0;
     if (cflags < 0) { c = d; cflags = dflags; }
       else if (c != d || cflags != dflags) return 0;
     break;

     case OP_EXACT:
     scode += IMM2_SIZE;
     /* Fall through */

     case OP_CHAR:
     case OP_PLUS:
     case OP_MINPLUS:
     case OP_POSPLUS:
     if (inassert == 0) return 0;
     if (cflags < 0) { c = scode[1]; cflags = 0; }
       else if (c != scode[1]) return 0;
     break;

     case OP_EXACTI:
     scode += IMM2_SIZE;
     /* Fall through */

     case OP_CHARI:
     case OP_PLUSI:
     case OP_MINPLUSI:
     case OP_POSPLUSI:
     if (inassert == 0) return 0;
     if (cflags < 0) { c = scode[1]; cflags = REQ_CASELESS; }
       else if (c != scode[1]) return 0;
     break;
     }

   code += GET(code, 1);
   }
while (*code == OP_ALT);

*flags = cflags;
return c;
}